

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint64_t helper_neon_negl_u32_aarch64(uint64_t x)

{
  return (ulong)(uint)-(int)x - (x & 0xffffffff00000000);
}

Assistant:

uint64_t HELPER(neon_negl_u32)(uint64_t x)
{
#ifdef _MSC_VER
    uint32_t low = 0 - x;
    uint32_t high = 0 - (x >> 32);
#else
    uint32_t low = -x;
    uint32_t high = -(x >> 32);
#endif
    return low | ((uint64_t)high << 32);
}